

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O3

Message * __thiscall google::protobuf::DynamicMessage::New(DynamicMessage *this,Arena *arena)

{
  TypeInfo *type_info;
  DynamicMessage *this_00;
  ulong uVar1;
  
  uVar1 = (ulong)this->type_info_->size;
  if (arena == (Arena *)0x0) {
    this_00 = (DynamicMessage *)operator_new(uVar1);
    type_info = this->type_info_;
    memset(this_00,0,(long)type_info->size);
    DynamicMessage(this_00,type_info);
  }
  else {
    uVar1 = uVar1 + 7 & 0xfffffffffffffff8;
    if (arena->hooks_cookie_ != (void *)0x0) {
      Arena::OnArenaAllocation(arena,(type_info *)&char::typeinfo,uVar1);
    }
    this_00 = (DynamicMessage *)Arena::AllocateAlignedNoHook(arena,uVar1);
    memset(this_00,0,(long)this->type_info_->size);
    DynamicMessage(this_00,this->type_info_,arena);
  }
  return &this_00->super_Message;
}

Assistant:

Message* DynamicMessage::New(Arena* arena) const {
  if (arena != NULL) {
    void* new_base = Arena::CreateArray<char>(arena, type_info_->size);
    memset(new_base, 0, type_info_->size);
    return new (new_base) DynamicMessage(type_info_, arena);
  } else {
    void* new_base = operator new(type_info_->size);
    memset(new_base, 0, type_info_->size);
    return new (new_base) DynamicMessage(type_info_);
  }
}